

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cport.cc
# Opt level: O3

shared_ptr<GenApi_3_4::CNodeMapRef> __thiscall
rcg::allocNodeMap(rcg *this,shared_ptr<const_rcg::GenTLWrapper> *gentl,void *port,CPort *cport,
                 char *xml)

{
  GC_ERROR GVar1;
  int iVar2;
  CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *__p;
  size_t sVar3;
  int *piVar4;
  ulonglong uVar5;
  ulonglong uVar6;
  char *pcVar7;
  GenTLException *pGVar8;
  long *plVar9;
  size_type *psVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  int iVar12;
  ulong uVar13;
  CPort *pCVar14;
  _Alloc_hider _Var15;
  ulong uVar16;
  shared_ptr<GenApi_3_4::CNodeMapRef> sVar17;
  size_t length;
  string name_1;
  INFO_DATATYPE type;
  uint32_t n;
  string url;
  string saddress;
  string slength;
  size_t size;
  gcstring portname;
  string name;
  char tmp [1024];
  ulonglong local_880;
  string local_878;
  CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *local_858;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_850;
  INFO_DATATYPE local_848;
  uint32_t local_844;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_840;
  CPort *local_820;
  char *local_818;
  undefined8 local_810;
  char local_808 [16];
  rcg *local_7f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_7f0;
  char *local_7e8;
  undefined8 local_7e0;
  char local_7d8 [16];
  size_t local_7c8;
  undefined1 local_7c0 [8];
  size_type local_7b8;
  char local_7b0 [96];
  ios_base local_750 [136];
  ios_base local_6c8 [264];
  string local_5c0 [4];
  ios_base local_540 [264];
  string local_438 [32];
  
  local_7f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)xml;
  __p = (CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *)operator_new(0x68);
  GenICam_3_4::gcstring::gcstring((gcstring *)local_438,"Device");
  (((CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *)&__p->super_CGeneric_XMLLoaderParams)->
  super_CGeneric_XMLLoaderParams)._vptr_CGeneric_XMLLoaderParams =
       (_func_int **)&PTR__Initialize_00132930;
  __p->_Ptr = (INodeMap *)0x0;
  GenICam_3_4::gcstring::gcstring(&__p->_DeviceName,(gcstring *)local_438);
  __p->_pRefCount = (int *)0x0;
  (((CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *)&__p->super_CGeneric_XMLLoaderParams)->
  super_CGeneric_XMLLoaderParams)._vptr_CGeneric_XMLLoaderParams =
       (_func_int **)&PTR__Initialize_00132858;
  local_858 = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<GenApi_3_4::CNodeMapRef*>
            (&_Stack_850,(CNodeMapRef *)__p);
  GenICam_3_4::gcstring::~gcstring((gcstring *)local_438);
  local_844 = 0;
  GVar1 = (*((gentl->super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            )->GCGetNumPortURLs)(port,&local_844);
  if (GVar1 != 0) {
    pGVar8 = (GenTLException *)__cxa_allocate_exception(0x28);
    local_438[0]._M_dataplus._M_p = (pointer)&local_438[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"allocNodeMap()","");
    GenTLException::GenTLException(pGVar8,local_438,gentl);
    __cxa_throw(pGVar8,&GenTLException::typeinfo,GenTLException::~GenTLException);
  }
  if (local_844 == 0) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    _Var11._M_pi = extraout_RDX;
    if (_Stack_850._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_850._M_pi);
      _Var11._M_pi = extraout_RDX_00;
    }
    goto LAB_0011626b;
  }
  memset(local_438,0,0x400);
  local_7c8 = 0x400;
  GVar1 = (*((gentl->super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            )->GCGetPortURLInfo)(port,0,0,&local_848,local_438,&local_7c8);
  if (GVar1 != 0) {
    pGVar8 = (GenTLException *)__cxa_allocate_exception(0x28);
    local_7c0 = (undefined1  [8])local_7b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_7c0,"allocNodeMap()","");
    GenTLException::GenTLException(pGVar8,(string *)local_7c0,gentl);
    __cxa_throw(pGVar8,&GenTLException::typeinfo,GenTLException::~GenTLException);
  }
  local_840._M_dataplus._M_p = (pointer)&local_840.field_2;
  sVar3 = strlen((char *)local_438);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_840,local_438,(long)&local_438[0]._M_dataplus._M_p + sVar3);
  local_820 = cport;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7c0);
  uVar13 = 6;
  if (local_840._M_string_length < 6) {
    uVar13 = local_840._M_string_length;
  }
  if (local_840._M_string_length != 0) {
    uVar16 = 0;
    do {
      iVar2 = tolower((int)local_840._M_dataplus._M_p[uVar16]);
      local_878._M_dataplus._M_p._0_1_ = (char)iVar2;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_7c0,(char *)&local_878,1);
      uVar16 = uVar16 + 1;
    } while (uVar13 != uVar16);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7c0);
  std::ios_base::~ios_base(local_750);
  iVar2 = std::__cxx11::string::compare((char *)local_5c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0[0]._M_dataplus._M_p != &local_5c0[0].field_2) {
    operator_delete(local_5c0[0]._M_dataplus._M_p);
  }
  if (iVar2 == 0) {
    std::__cxx11::string::compare((ulong)&local_840,6,(char *)0x3);
    std::__cxx11::string::substr((ulong)local_7c0,(ulong)&local_840);
    std::__cxx11::stringstream::stringstream
              ((stringstream *)local_5c0,(string *)local_7c0,_S_out|_S_in);
    if (local_7c0 != (undefined1  [8])local_7b0) {
      operator_delete((void *)local_7c0);
    }
    local_878._M_dataplus._M_p = (pointer)&local_878.field_2;
    local_878._M_string_length = 0;
    local_878.field_2._M_allocated_capacity =
         local_878.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_818 = local_808;
    local_810 = 0;
    local_808[0] = '\0';
    local_7e8 = local_7d8;
    local_7e0 = 0;
    local_7d8[0] = '\0';
    local_7f8 = this;
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_5c0,(string *)&local_878,';');
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_5c0,(string *)&local_818,';');
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_5c0,(string *)&local_7e8,';');
    pcVar7 = local_818;
    piVar4 = __errno_location();
    iVar2 = *piVar4;
    *piVar4 = 0;
    uVar5 = strtoull(pcVar7,(char **)local_7c0,0x10);
    if (local_7c0 == (undefined1  [8])pcVar7) {
      std::__throw_invalid_argument("stoull");
LAB_001164e4:
      std::__throw_invalid_argument("stoull");
LAB_001164f0:
      pGVar8 = (GenTLException *)__cxa_allocate_exception(0x28);
      local_7c0 = (undefined1  [8])local_7b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_7c0,"allocNodeMap()","");
      GenTLException::GenTLException(pGVar8,(string *)local_7c0,gentl);
      __cxa_throw(pGVar8,&GenTLException::typeinfo,GenTLException::~GenTLException);
    }
    iVar12 = *piVar4;
    if (iVar12 == 0) {
LAB_00115fbb:
      *piVar4 = iVar2;
      iVar12 = iVar2;
    }
    else if (iVar12 == 0x22) {
      std::__throw_out_of_range("stoull");
      goto LAB_00115fbb;
    }
    pcVar7 = local_7e8;
    *piVar4 = 0;
    uVar6 = strtoull(local_7e8,(char **)local_7c0,0x10);
    this = local_7f8;
    if (local_7c0 == (undefined1  [8])pcVar7) goto LAB_001164e4;
    if (*piVar4 == 0) {
LAB_00116018:
      *piVar4 = iVar12;
    }
    else if (*piVar4 == 0x22) {
      uVar6 = std::__throw_out_of_range("stoull");
      goto LAB_00116018;
    }
    local_880 = uVar6;
    pcVar7 = (char *)operator_new__(uVar6 + 1);
    GVar1 = (*((gentl->super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->GCReadPort)(port,uVar5,pcVar7,&local_880);
    pCVar14 = local_820;
    if (GVar1 != 0) goto LAB_001164f0;
    pcVar7[local_880] = '\0';
    if (local_7f0 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      _Var15._M_p = (pointer)local_7f0;
      if (local_7f0->_M_local_buf[0] == '\0') {
        _Var15._M_p = local_878._M_dataplus._M_p;
      }
      std::ofstream::ofstream(local_7c0,_Var15._M_p,_S_bin);
      (**(code **)(local_7b8 + 0x60))((filebuf *)&local_7b8,pcVar7,local_880);
      local_7c0 = (undefined1  [8])_VTT;
      *(undefined8 *)(local_7c0 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
      std::filebuf::~filebuf((filebuf *)&local_7b8);
      std::ios_base::~ios_base(local_6c8);
    }
    if (local_878._M_string_length < 5) {
LAB_00116135:
      GenICam_3_4::gcstring::gcstring((gcstring *)local_7c0,pcVar7);
      GenApi_3_4::CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>::_LoadXMLFromString
                (local_858,(gcstring *)local_7c0);
      GenICam_3_4::gcstring::~gcstring((gcstring *)local_7c0);
    }
    else {
      anon_unknown_3::toLower((string *)local_7c0,&local_878,local_878._M_string_length - 4,4);
      iVar2 = std::__cxx11::string::compare(local_7c0);
      if (local_7c0 != (undefined1  [8])local_7b0) {
        operator_delete((void *)local_7c0);
      }
      if (iVar2 != 0) goto LAB_00116135;
      GenApi_3_4::CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>::_LoadXMLFromZIPData
                (local_858,pcVar7,local_880);
    }
    operator_delete__(pcVar7);
    if (local_7e8 != local_7d8) {
      operator_delete(local_7e8);
    }
    if (local_818 != local_808) {
      operator_delete(local_818);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_878._M_dataplus._M_p != &local_878.field_2) {
      operator_delete(local_878._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_5c0);
    std::ios_base::~ios_base(local_540);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7c0);
    uVar13 = 5;
    if (local_840._M_string_length < 5) {
      uVar13 = local_840._M_string_length;
    }
    if (local_840._M_string_length != 0) {
      uVar16 = 0;
      do {
        iVar2 = tolower((int)local_840._M_dataplus._M_p[uVar16]);
        local_878._M_dataplus._M_p._0_1_ = (char)iVar2;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_7c0,(char *)&local_878,1);
        uVar16 = uVar16 + 1;
      } while (uVar13 != uVar16);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7c0);
    std::ios_base::~ios_base(local_750);
    iVar2 = std::__cxx11::string::compare((char *)local_5c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5c0[0]._M_dataplus._M_p != &local_5c0[0].field_2) {
      operator_delete(local_5c0[0]._M_dataplus._M_p);
    }
    if (iVar2 != 0) {
      pGVar8 = (GenTLException *)__cxa_allocate_exception(0x28);
      std::operator+(local_5c0,"allocNodeMap(): Cannot interpret URL: ",&local_840);
      std::__cxx11::string::string
                ((string *)local_7c0,local_5c0[0]._M_dataplus._M_p,(allocator *)&local_878);
      GenTLException::GenTLException(pGVar8,(string *)local_7c0);
      __cxa_throw(pGVar8,&GenTLException::typeinfo,GenTLException::~GenTLException);
    }
    std::__cxx11::string::compare((ulong)&local_840,5,(char *)0x3);
    std::__cxx11::string::substr((ulong)local_5c0,(ulong)&local_840);
    if (local_5c0[0]._M_string_length < 5) {
LAB_00115dfd:
      GenICam_3_4::gcstring::gcstring((gcstring *)local_7c0,local_5c0[0]._M_dataplus._M_p);
      GenApi_3_4::CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>::_LoadXMLFromFile
                (local_858,(gcstring *)local_7c0);
    }
    else {
      anon_unknown_3::toLower((string *)local_7c0,local_5c0,local_5c0[0]._M_string_length - 4,4);
      iVar2 = std::__cxx11::string::compare(local_7c0);
      if (local_7c0 != (undefined1  [8])local_7b0) {
        operator_delete((void *)local_7c0);
      }
      if (iVar2 != 0) goto LAB_00115dfd;
      GenICam_3_4::gcstring::gcstring((gcstring *)local_7c0,local_5c0[0]._M_dataplus._M_p);
      GenApi_3_4::CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>::_LoadXMLFromZIPFile
                (local_858,(gcstring *)local_7c0);
    }
    GenICam_3_4::gcstring::~gcstring((gcstring *)local_7c0);
    pCVar14 = local_820;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5c0[0]._M_dataplus._M_p != &local_5c0[0].field_2) {
      operator_delete(local_5c0[0]._M_dataplus._M_p);
      pCVar14 = local_820;
    }
  }
  local_7c8 = 0x400;
  GVar1 = (*((gentl->super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            )->GCGetPortInfo)(port,0xc,&local_848,local_438,&local_7c8);
  if (GVar1 != 0) {
    pGVar8 = (GenTLException *)__cxa_allocate_exception(0x28);
    local_7c0 = (undefined1  [8])local_7b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_7c0,"allocNodeMap()","");
    GenTLException::GenTLException(pGVar8,(string *)local_7c0,gentl);
    __cxa_throw(pGVar8,&GenTLException::typeinfo,GenTLException::~GenTLException);
  }
  GenICam_3_4::gcstring::gcstring((gcstring *)local_7c0,(char *)local_438);
  iVar2 = (*(local_858->super_CGeneric_XMLLoaderParams)._vptr_CGeneric_XMLLoaderParams[0xc])
                    (local_858,pCVar14,local_7c0);
  if ((char)iVar2 == '\0') {
    pGVar8 = (GenTLException *)__cxa_allocate_exception(0x28);
    local_818 = local_808;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_818,"allocNodeMap(): Cannot connect port: ","");
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_818);
    local_878._M_dataplus._M_p = (pointer)*plVar9;
    psVar10 = (size_type *)(plVar9 + 2);
    if ((size_type *)local_878._M_dataplus._M_p == psVar10) {
      local_878.field_2._M_allocated_capacity = *psVar10;
      local_878.field_2._8_8_ = plVar9[3];
      local_878._M_dataplus._M_p = (pointer)&local_878.field_2;
    }
    else {
      local_878.field_2._M_allocated_capacity = *psVar10;
    }
    local_878._M_string_length = plVar9[1];
    *plVar9 = (long)psVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::__cxx11::string::string
              ((string *)local_5c0,local_878._M_dataplus._M_p,(allocator *)&local_7e8);
    GenTLException::GenTLException(pGVar8,local_5c0);
    __cxa_throw(pGVar8,&GenTLException::typeinfo,GenTLException::~GenTLException);
  }
  GenICam_3_4::gcstring::~gcstring((gcstring *)local_7c0);
  _Var11._M_pi = extraout_RDX_01;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_840._M_dataplus._M_p != &local_840.field_2) {
    operator_delete(local_840._M_dataplus._M_p);
    _Var11._M_pi = extraout_RDX_02;
  }
  *(CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> **)this = local_858;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Stack_850._M_pi;
LAB_0011626b:
  sVar17.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var11._M_pi;
  sVar17.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<GenApi_3_4::CNodeMapRef>)
         sVar17.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<GenApi::CNodeMapRef> allocNodeMap(std::shared_ptr<const GenTLWrapper> gentl,
                                                  void *port, CPort *cport, const char *xml)
{
  std::shared_ptr<GenApi::CNodeMapRef> nodemap(new GenApi::CNodeMapRef());

  try
  {
    // get number of URLS that the given port provides

    uint32_t n=0;
    if (gentl->GCGetNumPortURLs(port, &n) != GenTL::GC_ERR_SUCCESS)
    {
      throw GenTLException("allocNodeMap()", gentl);
    }

    if (n == 0)
    {
      return std::shared_ptr<GenApi::CNodeMapRef>();
    }

    // get the first URL

    GenTL::INFO_DATATYPE type;
    char tmp[1024]="";
    size_t size=sizeof(tmp);

    if (gentl->GCGetPortURLInfo(port, 0, GenTL::URL_INFO_URL, &type, tmp, &size) !=
        GenTL::GC_ERR_SUCCESS)
    {
      throw GenTLException("allocNodeMap()", gentl);
    }

    // interpret the URL and load XML File

    std::string url=tmp;
    if (toLower(url, 0, 6) == "local:")
    {
      // interpret local URL

      size_t i=6;
      if (url.compare(i, 3, "///") == 0)
      {
        i+=3;
      }

      std::stringstream in(url.substr(i));
      std::string name, saddress, slength;

      std::getline(in, name, ';');
      std::getline(in, saddress, ';');
      std::getline(in, slength, ';');

      uint64_t address=std::stoull(saddress, 0, 16);
      size_t length=static_cast<size_t>(std::stoull(slength, 0, 16));

      // read XML or ZIP from registers

      std::unique_ptr<char[]> buffer(new char[length+1]);

      if (gentl->GCReadPort(port, address, buffer.get(), &length) != GenTL::GC_ERR_SUCCESS)
      {
        throw GenTLException("allocNodeMap()", gentl);
      }

      buffer.get()[length]='\0';

      // store XML file

      if (xml != 0)
      {
        if (xml[0] == '\0')
        {
          xml=name.c_str();
        }

        std::ofstream out(xml, std::ios::binary);

        out.rdbuf()->sputn(buffer.get(), static_cast<std::streamsize>(length));
      }

      // load XML or ZIP from registers

      if (name.size() > 4 && toLower(name, name.size()-4, 4) == ".zip")
      {
        nodemap->_LoadXMLFromZIPData(buffer.get(), length);
      }
      else
      {
        GENICAM_NAMESPACE::gcstring sxml=buffer.get();
        nodemap->_LoadXMLFromString(sxml);
      }
    }
    else if (toLower(url, 0, 5) == "file:")
    {
      // interpret local URL

      size_t i=5;
      if (url.compare(i, 3, "///") == 0)
      {
        i+=3;
      }

      std::string name=url.substr(i);

      // load XML or ZIP from file

      if (name.size() > 4 && toLower(name, name.size()-4, 4) == ".zip")
      {
        GENICAM_NAMESPACE::gcstring file=name.c_str();
        nodemap->_LoadXMLFromZIPFile(file);
      }
      else
      {
        GENICAM_NAMESPACE::gcstring file=name.c_str();
        nodemap->_LoadXMLFromFile(file);
      }
    }
    else
    {
      throw GenTLException(("allocNodeMap(): Cannot interpret URL: "+url).c_str());
    }

    // get port name

    size=sizeof(tmp);

    if (gentl->GCGetPortInfo(port, GenTL::PORT_INFO_PORTNAME, &type, tmp, &size) !=
        GenTL::GC_ERR_SUCCESS)
    {
      throw GenTLException("allocNodeMap()", gentl);
    }

    GENICAM_NAMESPACE::gcstring portname=tmp;
    if (!nodemap->_Connect(cport, portname))
    {
      throw GenTLException((std::string("allocNodeMap(): Cannot connect port: ")+tmp).c_str());
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    throw GenTLException(ex.what());
  }

  return nodemap;
}